

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.cpp
# Opt level: O2

int cmphstr(char **p1,char *p2,bool allowParenthesisEnd)

{
  byte bVar1;
  char cVar2;
  char *pcVar3;
  int iVar4;
  int iVar5;
  ulong uVar6;
  uint __c;
  
  pcVar3 = *p1;
  uVar6 = 0;
  while( true ) {
    bVar1 = p2[uVar6];
    __c = (uint)bVar1;
    if (bVar1 == 0) break;
    iVar4 = isalpha((uint)bVar1);
    if (iVar4 != 0) break;
    if (pcVar3[uVar6] != bVar1) goto LAB_0011fdaf;
    uVar6 = (ulong)((int)uVar6 + 1);
  }
  iVar4 = isupper((uint)(byte)pcVar3[uVar6]);
  if (iVar4 == 0) {
    while( true ) {
      iVar4 = (int)uVar6;
      if ((char)__c == '\0') break;
      if (pcVar3[uVar6] != (char)__c) goto LAB_0011fdaf;
      uVar6 = (ulong)(iVar4 + 1);
      __c = (uint)(byte)p2[uVar6];
    }
  }
  else {
    while (iVar4 = (int)uVar6, (char)__c != '\0') {
      cVar2 = pcVar3[uVar6];
      iVar5 = toupper(__c);
      if (iVar5 != cVar2) goto LAB_0011fdaf;
      uVar6 = (ulong)(iVar4 + 1);
      __c = (uint)(byte)p2[uVar6];
    }
  }
  bVar1 = pcVar3[uVar6];
  if ((bVar1 < 0x21) || (bVar1 == 0x3b)) {
LAB_0011fd93:
    *p1 = pcVar3 + uVar6;
    iVar4 = 1;
  }
  else {
    if (bVar1 == 0x2f) {
      if ((pcVar3[iVar4 + 1] == '*') || (pcVar3[iVar4 + 1] == '/')) goto LAB_0011fd93;
    }
    else if (allowParenthesisEnd && bVar1 == 0x28) goto LAB_0011fd93;
LAB_0011fdaf:
    iVar4 = 0;
  }
  return iVar4;
}

Assistant:

int cmphstr(char*& p1, const char* p2, bool allowParenthesisEnd) {
	unsigned int i = 0;
	// check initial non-alpha chars without deciding the upper/lower case of test
	while (p2[i] && !isalpha((byte)p2[i])) {
		if (p1[i] != p2[i]) return 0;
		++i;
	}
	// now the first alpha char will make whole test upper or lower case like.
	if (isupper((byte)p1[i])) {
		while (p2[i]) {
			if (p1[i] != toupper((byte)p2[i])) return 0;
			++i;
		}
	} else {
		while (p2[i]) {
			if (p1[i] != p2[i]) return 0;
			++i;
		}
	}
	if (p1[i]) {		// there is some character after the first word
		// whitespace, EOL-comment and block-comment-start keep the match valid
		// also starting parenthesis when allowParenthesisEnd
		if (
			!White(p1[i]) && \
			!(';' == p1[i]) && \
			!('/' == p1[i] && '/' == p1[i+1]) && \
			!('/' == p1[i] && '*' == p1[i+1]) && \
			!(allowParenthesisEnd && '(' == p1[i])
		) {
			return 0;	// anything else invalidates the found match
		}
	}
	// space, tab, enter, \0, ... => "match"
	p1 += i;
	return 1;
}